

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::ByteSizeLong(GeneratedCodeInfo_Annotation *this)

{
  bool bVar1;
  int iVar2;
  int32 iVar3;
  UnknownFieldSet *unknown_fields;
  size_t sVar4;
  size_t sVar5;
  string *value;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  GeneratedCodeInfo_Annotation *this_local;
  
  data_size = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = GeneratedCodeInfo_Annotation::unknown_fields(this);
    data_size = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  sVar4 = internal::WireFormatLite::Int32Size(&this->path_);
  if (sVar4 != 0) {
    sVar5 = internal::WireFormatLite::Int32Size((int32)sVar4);
    data_size = sVar5 + 1 + data_size;
  }
  iVar2 = internal::ToCachedSize(sVar4);
  this->_path_cached_byte_size_ = iVar2;
  data_size = sVar4 + data_size;
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    bVar1 = has_source_file(this);
    if (bVar1) {
      value = source_file_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(value);
      data_size = sVar4 + 1 + data_size;
    }
    bVar1 = has_begin(this);
    if (bVar1) {
      iVar3 = begin(this);
      sVar4 = internal::WireFormatLite::Int32Size(iVar3);
      data_size = sVar4 + 1 + data_size;
    }
    bVar1 = has_end(this);
    if (bVar1) {
      iVar3 = end(this);
      sVar4 = internal::WireFormatLite::Int32Size(iVar3);
      data_size = sVar4 + 1 + data_size;
    }
  }
  iVar2 = internal::ToCachedSize(data_size);
  this->_cached_size_ = iVar2;
  return data_size;
}

Assistant:

size_t GeneratedCodeInfo_Annotation::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.GeneratedCodeInfo.Annotation)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated int32 path = 1 [packed = true];
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->path_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _path_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 7u) {
    // optional string source_file = 2;
    if (has_source_file()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->source_file());
    }

    // optional int32 begin = 3;
    if (has_begin()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->begin());
    }

    // optional int32 end = 4;
    if (has_end()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->end());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}